

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_CreateString(char *string)

{
  cJSON *pcVar1;
  size_t sVar2;
  char *__dest;
  
  pcVar1 = (cJSON *)(*cJSON_malloc)(0x40);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar1->type = 0;
    pcVar1->valuedouble = 0.0;
    pcVar1->string = (char *)0x0;
    pcVar1->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar1->valueint = 0;
    pcVar1->next = (cJSON *)0x0;
    pcVar1->prev = (cJSON *)0x0;
    pcVar1->type = 4;
    sVar2 = strlen(string);
    __dest = (char *)(*cJSON_malloc)(sVar2 + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,string,sVar2 + 1);
    }
    pcVar1->valuestring = __dest;
  }
  return pcVar1;
}

Assistant:

cJSON *
cJSON_CreateString(const char *string)
{
    cJSON *item = cJSON_New_Item();
    if (item) {
        item->type = cJSON_String;
        item->valuestring = cJSON_strdup(string);
    }
    return item;
}